

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_common.hxx
# Opt level: O3

void calc_server::loop(void)

{
  long lVar1;
  uint __val;
  bool bVar2;
  long *plVar3;
  ostream *poVar4;
  uint uVar5;
  pointer pbVar6;
  long *plVar7;
  ulong uVar8;
  uint __len;
  uint uVar9;
  string prompt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string __str;
  char cmd [1000];
  long *local_478;
  long local_468;
  long lStack_460;
  undefined1 local_458 [24];
  long lStack_440;
  undefined1 *local_438 [2];
  undefined1 local_428 [16];
  calc_server local_418 [1000];
  
  __val = -stuff;
  if (0 < (int)stuff) {
    __val = stuff;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar9 = 4;
    do {
      __len = uVar9;
      uVar5 = (uint)uVar8;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_0017d642;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_0017d642;
      }
      if (uVar5 < 10000) goto LAB_0017d642;
      uVar8 = uVar8 / 10000;
      uVar9 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_0017d642:
  uVar9 = stuff >> 0x1f;
  local_438[0] = local_428;
  std::__cxx11::string::_M_construct((ulong)local_438,(char)__len - (char)((int)stuff >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_438[0] + uVar9,__len,__val);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_438,0,(char *)0x0,0x46a13d);
  pbVar6 = (pointer)(plVar3 + 2);
  if ((pointer)*plVar3 == pbVar6) {
    local_458._16_8_ = (pbVar6->_M_dataplus)._M_p;
    lStack_440 = plVar3[3];
    local_458._0_8_ = (pointer)(local_458 + 0x10);
  }
  else {
    local_458._16_8_ = (pbVar6->_M_dataplus)._M_p;
    local_458._0_8_ = (pointer)*plVar3;
  }
  local_458._8_8_ = plVar3[1];
  *plVar3 = (long)pbVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_458);
  local_478 = &local_468;
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_468 = *plVar7;
    lStack_460 = plVar3[3];
  }
  else {
    local_468 = *plVar7;
    local_478 = (long *)*plVar3;
  }
  lVar1 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((pointer)local_458._0_8_ != (pointer)(local_458 + 0x10)) {
    operator_delete((void *)local_458._0_8_);
  }
  if (local_438[0] != local_428) {
    operator_delete(local_438[0]);
  }
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[32m",5);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_478,lVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[0m",4);
    std::ios::widen((char)*(undefined8 *)(std::cin + -0x18));
    plVar3 = (long *)std::istream::getline((char *)&std::cin,(long)local_418,-0x18);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) break;
    tokenize_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_458,local_418,(char *)0x20,(char)*(long *)(*plVar3 + -0x18));
    bVar2 = do_cmd((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_458);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_458);
  } while (bVar2);
  if (local_478 != &local_468) {
    operator_delete(local_478);
  }
  return;
}

Assistant:

void loop() {
    char cmd[1000];
    std::string prompt = "calc " + std::to_string(stuff.server_id_) + "> ";
    while (true) {
#if defined(__linux__) || defined(__APPLE__)
        std::cout << _CLM_GREEN << prompt << _CLM_END;
#else
        std::cout << prompt;
#endif
        if (!std::cin.getline(cmd, 1000)) {
            break;
        }

        std::vector<std::string> tokens = tokenize(cmd);
        bool cont = do_cmd(tokens);
        if (!cont) break;
    }
}